

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O0

optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> * __thiscall
kratos::Simulator::get_complex_value_
          (optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
           *__return_storage_ptr__,Simulator *this,Var *var)

{
  uint uVar1;
  initializer_list<unsigned_long> __l;
  bool bVar2;
  VarType VVar3;
  int iVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar7;
  size_type sVar8;
  const_reference pvVar9;
  unsigned_long *puVar10;
  undefined4 extraout_var;
  InternalException *this_00;
  mapped_type *pmVar11;
  optional<unsigned_long> oVar12;
  _Node_iterator_base<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
  local_178;
  _Node_iterator_base<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
  local_170;
  allocator<unsigned_long> local_161;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_160;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_158;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_150;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_148;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_140;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_138;
  uint local_120;
  uint local_11c;
  uint high;
  uint low;
  mapped_type values;
  _Node_iterator_base<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
  local_f8;
  _Node_iterator_base<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
  local_f0;
  undefined1 local_e2;
  allocator<char> local_e1;
  string local_e0;
  uint *local_c0;
  type *var_low;
  type *var_high;
  undefined4 local_a8;
  undefined1 local_a0 [8];
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  index;
  Var *root;
  allocator<unsigned_long> local_69;
  unsigned_long local_68;
  iterator local_60;
  size_type local_58;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_50;
  _Storage<unsigned_long,_true> local_38;
  optional<unsigned_long> v;
  Var *local_20;
  Var *var_local;
  Simulator *this_local;
  
  local_20 = var;
  var_local = (Var *)this;
  this_local = (Simulator *)__return_storage_ptr__;
  if (var == (Var *)0x0) {
    std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::optional
              (__return_storage_ptr__);
  }
  else {
    pvVar7 = Var::size(var);
    sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar7);
    if (sVar8 == 1) {
      pvVar7 = Var::size(local_20);
      pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::front(pvVar7);
      if (*pvVar9 == 1) {
        oVar12 = get_value_(this,local_20);
        local_38._M_value =
             oVar12.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._M_payload;
        v.super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ =
             oVar12.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._M_engaged;
        bVar2 = std::optional::operator_cast_to_bool((optional *)&local_38);
        if (!bVar2) {
          std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::optional
                    (__return_storage_ptr__);
          return __return_storage_ptr__;
        }
        puVar10 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)&local_38);
        local_68 = *puVar10;
        local_60 = &local_68;
        local_58 = 1;
        std::allocator<unsigned_long>::allocator(&local_69);
        __l._M_len = local_58;
        __l._M_array = local_60;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_50,__l,&local_69);
        std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::
        optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true>
                  (__return_storage_ptr__,&local_50);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_50);
        std::allocator<unsigned_long>::~allocator(&local_69);
        return __return_storage_ptr__;
      }
    }
    VVar3 = Var::type(local_20);
    if (VVar3 == Slice) {
      iVar4 = (*(local_20->super_IRNode)._vptr_IRNode[0x28])();
      index.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(extraout_var,iVar4);
      get_slice_index((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                       *)local_a0,this,local_20);
      bVar2 = std::
              vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              ::empty((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                       *)local_a0);
      if (bVar2) {
        std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::optional
                  (__return_storage_ptr__);
        local_a8 = 1;
      }
      else {
        var_high = (type *)compute_var_high_low
                                     ((Var *)index.
                                             super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                      (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                       *)local_a0);
        var_low = std::get<0ul,unsigned_int,unsigned_int>
                            ((pair<unsigned_int,_unsigned_int> *)&var_high);
        local_c0 = std::get<1ul,unsigned_int,unsigned_int>
                             ((pair<unsigned_int,_unsigned_int> *)&var_high);
        uVar1 = *local_c0;
        uVar5 = Var::var_width((Var *)index.
                                      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (uVar1 % uVar5 != 0) {
LAB_00a6d193:
          local_e2 = 1;
          this_00 = (InternalException *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e0,"Misaligned vector slicing",&local_e1);
          InternalException::InternalException(this_00,&local_e0);
          local_e2 = 0;
          __cxa_throw(this_00,&InternalException::typeinfo,InternalException::~InternalException);
        }
        uVar1 = *var_low;
        uVar5 = Var::var_width((Var *)index.
                                      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        uVar6 = Var::var_width((Var *)index.
                                      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (uVar1 % uVar5 != uVar6 - 1) goto LAB_00a6d193;
        local_f0._M_cur =
             (__node_type *)
             std::
             unordered_map<const_kratos::Var_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
             ::find(&this->complex_values_,
                    (key_type *)
                    &index.
                     super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
        local_f8._M_cur =
             (__node_type *)
             std::
             unordered_map<const_kratos::Var_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
             ::end(&this->complex_values_);
        bVar2 = std::__detail::operator==(&local_f0,&local_f8);
        if (bVar2) {
          std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::optional
                    (__return_storage_ptr__);
          local_a8 = 1;
        }
        else {
          pmVar11 = std::
                    unordered_map<const_kratos::Var_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                    ::at(&this->complex_values_,
                         (key_type *)
                         &index.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&high,pmVar11);
          uVar1 = *local_c0;
          uVar5 = Var::var_width((Var *)index.
                                        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
          local_11c = uVar1 / uVar5;
          uVar1 = *var_low;
          uVar5 = Var::var_width((Var *)index.
                                        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
          local_120 = uVar1 / uVar5;
          local_148._M_current =
               (unsigned_long *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&high);
          local_140 = __gnu_cxx::
                      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      ::operator+(&local_148,(ulong)local_11c);
          local_160._M_current =
               (unsigned_long *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&high);
          local_158 = __gnu_cxx::
                      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      ::operator+(&local_160,(ulong)local_120);
          local_150 = __gnu_cxx::
                      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      ::operator+(&local_158,1);
          std::allocator<unsigned_long>::allocator(&local_161);
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          vector<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,void>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_138,local_140,
                     local_150,&local_161);
          std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::
          optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true>
                    (__return_storage_ptr__,&local_138);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_138);
          std::allocator<unsigned_long>::~allocator(&local_161);
          local_a8 = 1;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&high);
        }
      }
      std::
      vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ::~vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 *)local_a0);
    }
    else {
      local_170._M_cur =
           (__node_type *)
           std::
           unordered_map<const_kratos::Var_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
           ::find(&this->complex_values_,&local_20);
      local_178._M_cur =
           (__node_type *)
           std::
           unordered_map<const_kratos::Var_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
           ::end(&this->complex_values_);
      bVar2 = std::__detail::operator==(&local_170,&local_178);
      if (bVar2) {
        std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::optional
                  (__return_storage_ptr__);
      }
      else {
        pmVar11 = std::
                  unordered_map<const_kratos::Var_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                  ::at(&this->complex_values_,&local_20);
        std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::
        optional<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&,_true>
                  (__return_storage_ptr__,pmVar11);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::vector<uint64_t>> Simulator::get_complex_value_(const kratos::Var *var) const {
    if (!var) return std::nullopt;
    if (var->size().size() == 1 && var->size().front() == 1) {
        // this is a scalar
        auto v = get_value_(var);
        if (v)
            return std::vector<uint64_t>{*v};
        else
            return std::nullopt;
    }
    if (var->type() == VarType::Slice) {
        auto const *root = var->get_var_root_parent();
        auto index = get_slice_index(var);
        if (index.empty()) return std::nullopt;
        auto const [var_high, var_low] = compute_var_high_low(root, index);
        if (var_low % root->var_width() != 0 ||
            (var_high % root->var_width() != root->var_width() - 1))
            throw InternalException("Misaligned vector slicing");
        if (complex_values_.find(root) == complex_values_.end()) return std::nullopt;
        auto values = complex_values_.at(root);
        // compute the slice range
        auto low = var_low / root->var_width();
        auto high = var_high / root->var_width();
        return std::vector<uint64_t>(values.begin() + low, values.end() + high + 1);
    } else {
        if (complex_values_.find(var) == complex_values_.end()) return std::nullopt;
        return complex_values_.at(var);
    }
}